

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O0

void pgraph_dump_control(int cnum,pgraph_state *state)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  reference this;
  pointer pRVar5;
  undefined4 extraout_var;
  bool is_nv17p;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *reg;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  *__range1;
  pgraph_state *state_local;
  int cnum_local;
  
  hwtest::pgraph::pgraph_control_regs
            ((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
              *)&__begin1,&state->chipset);
  __end1 = std::
           vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
           ::begin((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                    *)&__begin1);
  reg = (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *)
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
        ::end((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
               *)&__begin1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_*,_std::vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>_>
                                     *)&reg), bVar1) {
    this = __gnu_cxx::
           __normal_iterator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_*,_std::vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>_>
           ::operator*(&__end1);
    pRVar5 = std::
             unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
             operator->(this);
    iVar2 = (*pRVar5->_vptr_Register[6])(pRVar5,(ulong)(uint)cnum);
    pRVar5 = std::
             unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
             operator->(this);
    iVar3 = (*pRVar5->_vptr_Register[3])(pRVar5,state);
    *(int *)CONCAT44(extraout_var,iVar3) = iVar2;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_*,_std::vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  ::~vector((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
             *)&__begin1);
  if ((state->chipset).card_type < 4) {
    uVar4 = nva_rd32(cnum,0x400100);
    state->intr = uVar4 & 0xfffffeff;
    uVar4 = nva_rd32(cnum,0x400104);
    state->invalid = uVar4;
  }
  else {
    uVar4 = nva_rd32(cnum,0x400100);
    state->intr = uVar4;
    uVar4 = nva_rd32(cnum,0x400108);
    state->nsource = uVar4;
    if ((0xf < (state->chipset).card_type) && ((state->chipset).card_type < 0x40)) {
      uVar4 = nva_rd32(cnum,0x40077c);
      state->state3d = uVar4;
    }
    bVar1 = nv04_pgraph_is_nv17p(&state->chipset);
    if (bVar1) {
      uVar4 = nva_rd32(cnum,0x400a00);
      state->zcull_unka00[0] = uVar4;
      uVar4 = nva_rd32(cnum,0x400a04);
      state->zcull_unka00[1] = uVar4;
      uVar4 = nva_rd32(cnum,0x400a10);
      state->unka10 = uVar4;
    }
  }
  return;
}

Assistant:

void pgraph_dump_control(int cnum, struct pgraph_state *state) {
	for (auto &reg : pgraph_control_regs(state->chipset)) {
		reg->ref(state) = reg->read(cnum);
	}
	if (state->chipset.card_type < 4) {
		state->intr = nva_rd32(cnum, 0x400100) & ~0x100;
		state->invalid = nva_rd32(cnum, 0x400104);
	} else {
		state->intr = nva_rd32(cnum, 0x400100);
		state->nsource = nva_rd32(cnum, 0x400108);
		if (state->chipset.card_type >= 0x10 && state->chipset.card_type < 0x40)
			state->state3d = nva_rd32(cnum, 0x40077c);
		bool is_nv17p = nv04_pgraph_is_nv17p(&state->chipset);
		if (is_nv17p) {
			state->zcull_unka00[0] = nva_rd32(cnum, 0x400a00);
			state->zcull_unka00[1] = nva_rd32(cnum, 0x400a04);
			state->unka10 = nva_rd32(cnum, 0x400a10);
		}
	}
}